

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3443::EvaluateSectionVelNorm
          (ChElementShellANCF_3443 *this,double xi,double eta,ChVector<double> *Result)

{
  VectorN Sxi_compact;
  Matrix3xN e_bardot;
  Matrix3xN *local_290;
  VectorN *local_288;
  VectorN local_280;
  Matrix3xN local_200;
  
  Calc_Sxi_compact(this,&local_280,xi,eta,0.0,this->m_thicknessZ,this->m_midsurfoffset);
  CalcCoordDerivMatrix(this,&local_200);
  local_290 = &local_200;
  local_288 = &local_280;
  ChVector<double>::operator=
            (Result,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>_>
                     *)&local_290);
  return;
}

Assistant:

void ChElementShellANCF_3443::EvaluateSectionVelNorm(const double xi, const double eta, ChVector<>& Result) {
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);

    Matrix3xN e_bardot;
    CalcCoordDerivMatrix(e_bardot);

    // rdot = S*edot written in compact form
    Result = e_bardot * Sxi_compact;
}